

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

Sample * __thiscall
deqp::gles3::Performance::anon_unknown_0::ReversedDepthOrderCullCase::renderSample
          (Sample *__return_storage_ptr__,ReversedDepthOrderCullCase *this,RenderData *occluder,
          RenderData *occluded,int workload)

{
  deUint32 dVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  deUint64 dVar6;
  deUint64 dVar7;
  deUint8 buffer [4];
  long lVar5;
  
  iVar3 = (*((this->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext[3])()
  ;
  lVar5 = CONCAT44(extraout_var,iVar3);
  dVar1 = (occluded->m_program).m_program.m_program;
  (**(code **)(lVar5 + 0x1680))(dVar1);
  pcVar2 = *(code **)(lVar5 + 0x14f0);
  uVar4 = (**(code **)(lVar5 + 0xb48))(dVar1,"u_iterations");
  (*pcVar2)(uVar4,workload);
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
  dVar6 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
  dVar7 = deGetMicroseconds();
  __return_storage_ptr__->nullTime = dVar7 - dVar6;
  dVar6 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x5e0))(0xb71);
  BaseCase::render((BaseCase *)this,occluded);
  BaseCase::render((BaseCase *)this,occluder);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
  dVar7 = deGetMicroseconds();
  __return_storage_ptr__->testTime = dVar7 - dVar6;
  dVar6 = deGetMicroseconds();
  (**(code **)(lVar5 + 0x188))(0x4500);
  (**(code **)(lVar5 + 0x4e8))(0xb71);
  BaseCase::render((BaseCase *)this,occluded);
  BaseCase::render((BaseCase *)this,occluder);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
  dVar7 = deGetMicroseconds();
  __return_storage_ptr__->baseTime = dVar7 - dVar6;
  __return_storage_ptr__->workload = 0;
  return __return_storage_ptr__;
}

Assistant:

Sample				renderSample				(const RenderData& occluder, const RenderData& occluded, int workload) const
	{
		const glw::Functions&	gl		= m_renderCtx.getFunctions();
		const GLuint			program	= occluded.m_program.getProgram();
		Sample					sample;
		deUint64				now		= 0;
		deUint64				prev	= 0;
		deUint8					buffer[4];

		gl.useProgram(program);
		gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), workload);

		// Warmup (this workload seems to reduce variation in following workloads)
		{
			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
		}

		// Null time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.nullTime = now - prev;
		}

		// Test time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.enable(GL_DEPTH_TEST);

			render(occluded);
			render(occluder);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.testTime = now - prev;
		}

		// Base time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			render(occluded);
			render(occluder);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.baseTime = now - prev;
		}

		sample.workload = 0;

		return sample;
	}